

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::sub_c(CPU *this)

{
  byte bVar1;
  byte bVar2;
  Registers *pRVar3;
  byte bVar4;
  byte bVar5;
  
  pRVar3 = this->regs;
  bVar1 = pRVar3->a;
  bVar2 = pRVar3->c;
  bVar4 = ((bVar1 & 0xf) < (bVar2 & 0xf)) * ' ';
  bVar5 = bVar4 + 0x40;
  if (bVar1 < bVar2) {
    bVar5 = bVar4 | 0x50;
  }
  pRVar3->f = bVar5;
  pRVar3->a = bVar1 - bVar2;
  if ((byte)(bVar1 - bVar2) == '\0') {
    pRVar3->f = bVar5 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::sub_c() {
    sub_r8(regs.c);
    return 1;
}